

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractSampleLists.cpp
# Opt level: O0

void writeSampleList(char *casePath,int listNdx,SampleList *sampleList)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  runtime_error *this;
  Item *pIVar4;
  Item *pIVar5;
  SampleValue *value;
  int valNdx;
  Sample *sample;
  int local_300;
  int sampleNdx;
  int ndx;
  ostream local_2d8 [8];
  ofstream out;
  string local_d8;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string filename;
  SampleList *sampleList_local;
  char *pcStack_10;
  int listNdx_local;
  char *casePath_local;
  
  filename.field_2._8_8_ = sampleList;
  sampleList_local._4_4_ = listNdx;
  pcStack_10 = casePath;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,casePath,&local_a1);
  std::operator+(&local_80,&local_a0,".");
  de::toString<int>(&local_d8,(int *)((long)&sampleList_local + 4));
  std::operator+(&local_60,&local_80,&local_d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,".csv");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_2d8,pcVar3,_S_bin);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ndx,
                   "Failed to open ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::runtime_error::runtime_error(this,(string *)&ndx);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_300 = 0;
  while( true ) {
    iVar2 = xe::ri::List::getNumItems((List *)(filename.field_2._8_8_ + 0x60));
    if (iVar2 <= local_300) break;
    if (local_300 != 0) {
      std::operator<<(local_2d8,",");
    }
    pIVar4 = xe::ri::List::getItem((List *)(filename.field_2._8_8_ + 0x60),local_300);
    std::operator<<(local_2d8,(string *)(pIVar4 + 1));
    local_300 = local_300 + 1;
  }
  std::operator<<(local_2d8,"\n");
  sample._4_4_ = 0;
  while( true ) {
    iVar2 = xe::ri::List::getNumItems((List *)(filename.field_2._8_8_ + 0x78));
    if (iVar2 <= sample._4_4_) break;
    pIVar4 = xe::ri::List::getItem((List *)(filename.field_2._8_8_ + 0x78),sample._4_4_);
    value._4_4_ = 0;
    while( true ) {
      iVar2 = xe::ri::List::getNumItems((List *)(pIVar4 + 1));
      if (iVar2 <= value._4_4_) break;
      pIVar5 = xe::ri::List::getItem((List *)(pIVar4 + 1),value._4_4_);
      if (value._4_4_ != 0) {
        std::operator<<(local_2d8,",");
      }
      xe::ri::operator<<(local_2d8,(NumericValue *)(pIVar5 + 1));
      value._4_4_ = value._4_4_ + 1;
    }
    std::operator<<(local_2d8,"\n");
    sample._4_4_ = sample._4_4_ + 1;
  }
  std::ofstream::~ofstream(local_2d8);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void writeSampleList (const char* casePath, int listNdx, const xe::ri::SampleList& sampleList)
{
	const string	filename	= string(casePath) + "." + de::toString(listNdx) + ".csv";
	std::ofstream	out			(filename.c_str(), std::ios_base::binary);

	if (!out.good())
		throw std::runtime_error("Failed to open " + filename);

	// Header
	for (int ndx = 0; ndx < sampleList.sampleInfo.valueInfos.getNumItems(); ndx++)
	{
		if (ndx != 0)
			out << ",";
		out << static_cast<const xe::ri::ValueInfo&>(sampleList.sampleInfo.valueInfos.getItem(ndx)).name;
	}
	out << "\n";

	// Samples
	for (int sampleNdx = 0; sampleNdx < sampleList.samples.getNumItems(); sampleNdx++)
	{
		const xe::ri::Sample&	sample	= static_cast<const xe::ri::Sample&>(sampleList.samples.getItem(sampleNdx));

		for (int valNdx = 0; valNdx < sample.values.getNumItems(); valNdx++)
		{
			const xe::ri::SampleValue&	value	= static_cast<const xe::ri::SampleValue&>(sample.values.getItem(valNdx));

			if (valNdx != 0)
				out << ",";

			out << value.value;
		}
		out << "\n";
	}
}